

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_mvd(bitstream *str,h264_cabac_context *cabac,int idx,int comp,int which,int32_t *val)

{
  h264_macroblock *phVar1;
  h264_macroblock *phVar2;
  h264_macroblock *phVar3;
  int local_88;
  int local_84;
  int ctxIdx [5];
  int inc;
  int sum;
  int absMvdCompB;
  int absMvdCompA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_macroblock *mbT;
  int local_40;
  int idxB;
  int idxA;
  int baseidx;
  int32_t *val_local;
  int local_28;
  int which_local;
  int comp_local;
  int idx_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  _idxA = val;
  val_local._4_4_ = which;
  local_28 = comp;
  which_local = idx;
  _comp_local = cabac;
  cabac_local = (h264_cabac_context *)str;
  if (cabac == (h264_cabac_context *)0x0) {
    str_local._4_4_ = vs_se(str,val);
  }
  else {
    idxB = 0x28;
    if (comp != 0) {
      idxB = 0x2f;
    }
    phVar1 = h264_mb_nb(cabac->slice,H264_MB_THIS,0);
    phVar2 = h264_mb_nb_b(_comp_local->slice,H264_MB_A,H264_BLOCK_4X4,0,which_local,&local_40);
    phVar3 = h264_mb_nb_b(_comp_local->slice,H264_MB_B,H264_BLOCK_4X4,0,which_local,
                          (int *)((long)&mbT + 4));
    sum = phVar2->mvd[val_local._4_4_][local_40][local_28];
    if (sum < 1) {
      sum = -sum;
    }
    inc = phVar3->mvd[val_local._4_4_][mbT._4_4_][local_28];
    if (inc < 1) {
      inc = -inc;
    }
    if (local_28 != 0) {
      if ((phVar1->mb_field_decoding_flag != 0) && (phVar2->mb_field_decoding_flag == 0)) {
        sum = sum / 2;
      }
      if ((phVar1->mb_field_decoding_flag == 0) && (phVar2->mb_field_decoding_flag != 0)) {
        sum = sum << 1;
      }
      if ((phVar1->mb_field_decoding_flag != 0) && (phVar3->mb_field_decoding_flag == 0)) {
        inc = inc / 2;
      }
      if ((phVar1->mb_field_decoding_flag == 0) && (phVar3->mb_field_decoding_flag != 0)) {
        inc = inc << 1;
      }
    }
    if (sum + inc < 3) {
      ctxIdx[4] = 0;
    }
    else if (sum + inc < 0x21) {
      ctxIdx[4] = 1;
    }
    else {
      ctxIdx[4] = 2;
    }
    local_88 = idxB + ctxIdx[4];
    local_84 = idxB + 3;
    ctxIdx[0] = idxB + 4;
    ctxIdx[1] = idxB + 5;
    ctxIdx[2] = idxB + 6;
    str_local._4_4_ = h264_cabac_ueg((bitstream *)cabac_local,_comp_local,&local_88,5,3,1,9,_idxA);
  }
  return str_local._4_4_;
}

Assistant:

int h264_mvd(struct bitstream *str, struct h264_cabac_context *cabac, int idx, int comp, int which, int32_t *val) {
	if (!cabac)
		return vs_se(str, val);
	int baseidx = (comp ? H264_CABAC_CTXIDX_MVD_Y : H264_CABAC_CTXIDX_MVD_X);
	int idxA, idxB;
	const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
	const struct h264_macroblock *mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_4X4, 0, idx, &idxA);
	const struct h264_macroblock *mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_4X4, 0, idx, &idxB);
	int absMvdCompA = abs(mbA->mvd[which][idxA][comp]);
	int absMvdCompB = abs(mbB->mvd[which][idxB][comp]);
	if (comp) {
		if (mbT->mb_field_decoding_flag && !mbA->mb_field_decoding_flag)
			absMvdCompA /= 2;
		if (!mbT->mb_field_decoding_flag && mbA->mb_field_decoding_flag)
			absMvdCompA *= 2;
		if (mbT->mb_field_decoding_flag && !mbB->mb_field_decoding_flag)
			absMvdCompB /= 2;
		if (!mbT->mb_field_decoding_flag && mbB->mb_field_decoding_flag)
			absMvdCompB *= 2;
	}
	int sum = absMvdCompA + absMvdCompB;
	int inc;
	if (sum < 3)
		inc = 0;
	else if (sum <= 32)
		inc = 1;
	else
		inc = 2;
	int ctxIdx[5];
	ctxIdx[0] = baseidx + inc;
	ctxIdx[1] = baseidx + 3;
	ctxIdx[2] = baseidx + 4;
	ctxIdx[3] = baseidx + 5;
	ctxIdx[4] = baseidx + 6;
	return h264_cabac_ueg(str, cabac, ctxIdx, 5, 3, 1, 9, val);
}